

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O0

void __thiscall
Memory::HeapInfo::FreeSmallObject<(Memory::ObjectInfoBits)32>
          (HeapInfo *this,void *object,size_t sizeCat)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *this_00;
  undefined8 *in_FS_OFFSET;
  size_t sizeCat_local;
  void *object_local;
  HeapInfo *this_local;
  
  BVar3 = IsAlignedSmallObjectSize(sizeCat);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x2a5,"(HeapInfo::IsAlignedSmallObjectSize(sizeCat))",
                       "HeapInfo::IsAlignedSmallObjectSize(sizeCat)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this_00 = &GetBucket<(Memory::ObjectInfoBits)32>(this,sizeCat)->
             super_HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>;
  HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_>::ExplicitFree
            (this_00,object,sizeCat);
  return;
}

Assistant:

inline void
HeapInfo::FreeSmallObject(void* object, size_t sizeCat)
{
    Assert(HeapInfo::IsAlignedSmallObjectSize(sizeCat));
    return this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat).ExplicitFree(object, sizeCat);
}